

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_robarm.cpp
# Opt level: O0

void __thiscall
EnvironmentROBARM::Create2DStateSpace(EnvironmentROBARM *this,State2D ***statespace2D)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  long *in_RSI;
  long *in_RDI;
  int y;
  int x;
  int local_18;
  int local_14;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)in_RDI[7];
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  *in_RSI = (long)pvVar4;
  for (local_14 = 0; local_14 < (int)in_RDI[7]; local_14 = local_14 + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)*(int *)((long)in_RDI + 0x3c);
    uVar3 = SUB168(auVar2 * ZEXT816(0xc),0);
    if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    *(void **)(*in_RSI + (long)local_14 * 8) = pvVar4;
    for (local_18 = 0; local_18 < (int)in_RDI[7]; local_18 = local_18 + 1) {
      (**(code **)(*in_RDI + 0x110))
                (in_RDI,*(long *)(*in_RSI + (long)local_14 * 8) + (long)local_18 * 0xc,
                 (short)local_14,(short)local_18);
    }
  }
  return;
}

Assistant:

void EnvironmentROBARM::Create2DStateSpace(State2D*** statespace2D)
{
    int x, y;

    //allocate a statespace for 2D search
    *statespace2D = new State2D*[EnvROBARMCfg.EnvWidth_c];
    for (x = 0; x < EnvROBARMCfg.EnvWidth_c; x++) {
        (*statespace2D)[x] = new State2D[EnvROBARMCfg.EnvHeight_c];
        for (y = 0; y < EnvROBARMCfg.EnvWidth_c; y++) {
            InitializeState2D(&(*statespace2D)[x][y], x, y);
        }
    }
}